

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

void __thiscall cppgenerate::Class::Class(Class *this,Class *other)

{
  pointer pcVar1;
  
  (this->m_className)._M_dataplus._M_p = (pointer)&(this->m_className).field_2;
  pcVar1 = (other->m_className)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->m_className)._M_string_length);
  (this->m_namespace)._M_dataplus._M_p = (pointer)&(this->m_namespace).field_2;
  pcVar1 = (other->m_namespace)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_namespace,pcVar1,pcVar1 + (other->m_namespace)._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->m_systemIncludes)._M_t,&(other->m_systemIncludes)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->m_localIncludes)._M_t,&(other->m_localIncludes)._M_t);
  std::vector<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>::vector
            (&this->m_methods,&other->m_methods);
  std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::vector
            (&this->m_memberVariables,&other->m_memberVariables);
  std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::vector
            (&this->m_constructors,&other->m_constructors);
  std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::vector
            (&this->m_parents,&other->m_parents);
  (this->m_documentation)._M_dataplus._M_p = (pointer)&(this->m_documentation).field_2;
  pcVar1 = (other->m_documentation)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_documentation,pcVar1,
             pcVar1 + (other->m_documentation)._M_string_length);
  this->m_isQobject = other->m_isQobject;
  return;
}

Assistant:

Class::Class( const Class& other ) :
    m_className( other.m_className ),
    m_namespace( other.m_namespace ),
    m_systemIncludes( other.m_systemIncludes ),
    m_localIncludes( other.m_localIncludes ),
    m_methods( other.m_methods ),
    m_memberVariables( other.m_memberVariables ),
    m_constructors( other.m_constructors ),
    m_parents( other.m_parents ),
    m_documentation( other.m_documentation ),
    m_isQobject( other.m_isQobject )
{}